

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool ON_IsUnsignedChunkTypecode(ON__UINT32 typecode)

{
  undefined1 local_d;
  ON__UINT32 typecode_local;
  
  local_d = true;
  if (((((typecode & 0x80000000) != 0) && (local_d = true, typecode != 0x80400001)) &&
      (local_d = true, typecode != 0x80400006)) && (local_d = true, typecode != 0xa0000026)) {
    local_d = typecode == 0x82000071;
  }
  return local_d;
}

Assistant:

bool ON_IsUnsignedChunkTypecode( ON__UINT32 typecode )
{
  // returns tru if the chunk value should be treated as an unsigned int.
  return ( 0 == (TCODE_SHORT & typecode)
           || TCODE_RGB == typecode 
           || TCODE_RGBDISPLAY == typecode
           || TCODE_PROPERTIES_OPENNURBS_VERSION == typecode
           || TCODE_OBJECT_RECORD_TYPE == typecode
         );
}